

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_run.c
# Opt level: O0

TestResult * receive_result_info_nofork(char *tcname,char *tname,int iter,int duration)

{
  TestResult *tr_00;
  TestResult *tr;
  int duration_local;
  int iter_local;
  char *tname_local;
  char *tcname_local;
  
  tr_00 = receive_test_result(0);
  if (tr_00 == (TestResult *)0x0) {
    eprintf("Failed to receive test result",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_run.c"
            ,0x1b8);
  }
  tr_00->tcname = tcname;
  tr_00->tname = tname;
  tr_00->iter = iter;
  tr_00->duration = duration;
  set_nofork_info(tr_00);
  return tr_00;
}

Assistant:

static TestResult *receive_result_info_nofork(const char *tcname,
                                              const char *tname,
                                              int iter, int duration)
{
    TestResult *tr;

    tr = receive_test_result(0);
    if(tr == NULL)
    {
        eprintf("Failed to receive test result", __FILE__, __LINE__);
    }
    else
    {
        tr->tcname = tcname;
        tr->tname = tname;
        tr->iter = iter;
        tr->duration = duration;
        set_nofork_info(tr);
    }

    return tr;
}